

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void clip_addchar(clip_workbuf *b,wchar_t chr,wchar_t attr,truecolour tc)

{
  wchar_t *pwVar1;
  truecolour *ptVar2;
  
  if (b->bufsize <= b->bufpos) {
    pwVar1 = (wchar_t *)safegrowarray(b->textbuf,&b->bufsize,4,b->bufpos,1,false);
    b->textbuf = pwVar1;
    b->textptr = pwVar1 + b->bufpos;
    pwVar1 = (wchar_t *)saferealloc(b->attrbuf,b->bufsize,4);
    b->attrbuf = pwVar1;
    b->attrptr = pwVar1 + b->bufpos;
    ptVar2 = (truecolour *)saferealloc(b->tcbuf,b->bufsize,8);
    b->tcbuf = ptVar2;
    b->tcptr = ptVar2 + b->bufpos;
  }
  pwVar1 = b->textptr;
  b->textptr = pwVar1 + 1;
  *pwVar1 = chr;
  pwVar1 = b->attrptr;
  b->attrptr = pwVar1 + 1;
  *pwVar1 = attr;
  ptVar2 = b->tcptr;
  b->tcptr = ptVar2 + 1;
  *ptVar2 = tc;
  b->bufpos = b->bufpos + 1;
  return;
}

Assistant:

static void clip_addchar(clip_workbuf *b, wchar_t chr, int attr, truecolour tc)
{
    if (b->bufpos >= b->bufsize) {
        sgrowarray(b->textbuf, b->bufsize, b->bufpos);
        b->textptr = b->textbuf + b->bufpos;
        b->attrbuf = sresize(b->attrbuf, b->bufsize, int);
        b->attrptr = b->attrbuf + b->bufpos;
        b->tcbuf = sresize(b->tcbuf, b->bufsize, truecolour);
        b->tcptr = b->tcbuf + b->bufpos;
    }
    *b->textptr++ = chr;
    *b->attrptr++ = attr;
    *b->tcptr++ = tc;
    b->bufpos++;
}